

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

void __thiscall helics::MessageFederate::loadFederateData(MessageFederate *this)

{
  __uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  __p;
  undefined4 local_2c;
  MessageFederate *local_28;
  MessageFederate *local_20;
  __uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  local_18;
  
  local_20 = *(MessageFederate **)(&this->field_0x18 + (long)this->_vptr_MessageFederate[-3]);
  local_2c = *(undefined4 *)(&this->field_0x10 + (long)this->_vptr_MessageFederate[-3]);
  local_28 = this;
  std::
  make_unique<helics::MessageFederateManager,helics::Core*,helics::MessageFederate*,helics::LocalFederateId,bool&>
            ((Core **)&local_18,&local_20,(LocalFederateId *)&local_28,(bool *)&local_2c);
  __p._M_t.
  super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
  .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
       .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
  .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl =
       (tuple<helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
        )(_Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
          )0x0;
  std::
  __uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
           *)&this->mfManager,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                   .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl);
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  ~unique_ptr((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
               *)&local_18);
  if (*(long *)(&this->field_0x40 + (long)this->_vptr_MessageFederate[-3]) != 0) {
    registerMessageInterfaces
              (this,(string *)(&this->field_0x38 + (long)this->_vptr_MessageFederate[-3]));
  }
  return;
}

Assistant:

void MessageFederate::loadFederateData()
{
    mfManager = std::make_unique<MessageFederateManager>(coreObject.get(),
                                                         this,
                                                         getID(),
                                                         singleThreadFederate);
    if (!configFile.empty()) {
        MessageFederate::registerMessageInterfaces(configFile);
    }
}